

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::ComputeSubRange::operator()
          (ComputeSubRange *this,Random *random,int dstMin,int dstMax,int *aMin,int *aMax,int *bMin,
          int *bMax)

{
  int iVar1;
  GetRandom local_41 [8];
  GetRandom local_39;
  int aOffset;
  int local_34;
  int subRangeLen;
  int rangeLen;
  int *aMax_local;
  int *aMin_local;
  int dstMax_local;
  int dstMin_local;
  Random *random_local;
  ComputeSubRange *this_local;
  
  local_34 = dstMax - dstMin;
  _subRangeLen = aMax;
  aMax_local = aMin;
  aMin_local._0_4_ = dstMax;
  aMin_local._4_4_ = dstMin;
  _dstMax_local = random;
  random_local = (Random *)this;
  aOffset = operator()<int>::GetRandom::operator()(&local_39,random,0,local_34);
  iVar1 = operator()<int>::GetRandom::operator()(local_41,_dstMax_local,-8,8);
  *aMax_local = aMin_local._4_4_ + iVar1;
  *_subRangeLen = *aMax_local + aOffset;
  *bMin = iVar1 - (local_34 - aOffset);
  *bMax = iVar1;
  return;
}

Assistant:

void ComputeSubRange::operator() (de::Random& random, T dstMin, T dstMax, T& aMin, T& aMax, T& bMin, T& bMax) const
{
	struct GetRandom
	{
		int		operator() (de::Random& rnd, int min, int max) const		{ return rnd.getInt(min, max); }
		float	operator() (de::Random& rnd, float min, float max) const	{ return getQuantizedFloat(rnd, min, max, 0.5f); }
	};

	T rangeLen		= dstMax-dstMin;
	T subRangeLen	= GetRandom()(random, T(0), rangeLen);
	T aOffset		= GetRandom()(random, T(-8), T(8));

	aMin			= dstMin+aOffset;
	aMax			= aMin+subRangeLen;

	bMin			= aOffset-(rangeLen-subRangeLen);
	bMax			= aOffset;

#if defined(DE_DEBUG)
	T eps = T(0.001);
	DE_ASSERT(aMin <= aMax && bMin <= bMax);
	DE_ASSERT(de::inRange(aMin-bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMin-bMax, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax-bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax-bMax, dstMin-eps, dstMax+eps));
#endif
}